

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::cmake(cmake *this,Role role,Mode mode)

{
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  cmFileTimeCache *this_02;
  cmState *this_03;
  cmMessenger *pcVar4;
  cmVariableWatch *this_04;
  ulong in_R8;
  cmStateSnapshot local_48;
  
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GeneratorInstance)._M_dataplus._M_p = (pointer)&(this->GeneratorInstance).field_2;
  (this->GeneratorInstance)._M_string_length = 0;
  (this->GeneratorInstance).field_2._M_local_buf[0] = '\0';
  (this->GeneratorPlatform)._M_dataplus._M_p = (pointer)&(this->GeneratorPlatform).field_2;
  (this->GeneratorPlatform)._M_string_length = 0;
  (this->GeneratorPlatform).field_2._M_local_buf[0] = '\0';
  (this->GeneratorToolset)._M_dataplus._M_p = (pointer)&(this->GeneratorToolset).field_2;
  (this->GeneratorToolset)._M_string_length = 0;
  (this->GeneratorToolset).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->ProgressCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ProgressCallback).super__Function_base._M_functor + 8) = 0;
  (this->ProgressCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ProgressCallback)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CMakeEditCommand)._M_dataplus._M_p = (pointer)&(this->CMakeEditCommand).field_2;
  (this->CMakeEditCommand)._M_string_length = 0;
  (this->CMakeEditCommand).field_2._M_local_buf[0] = '\0';
  (this->CXXEnvironment)._M_dataplus._M_p = (pointer)&(this->CXXEnvironment).field_2;
  (this->CXXEnvironment)._M_string_length = 0;
  (this->CXXEnvironment).field_2._M_local_buf[0] = '\0';
  (this->CCEnvironment)._M_dataplus._M_p = (pointer)&(this->CCEnvironment).field_2;
  (this->CCEnvironment)._M_string_length = 0;
  (this->CCEnvironment).field_2._M_local_buf[0] = '\0';
  (this->CheckBuildSystemArgument)._M_dataplus._M_p =
       (pointer)&(this->CheckBuildSystemArgument).field_2;
  (this->CheckBuildSystemArgument)._M_string_length = 0;
  (this->CheckBuildSystemArgument).field_2._M_local_buf[0] = '\0';
  (this->CheckStampFile)._M_dataplus._M_p = (pointer)&(this->CheckStampFile).field_2;
  (this->CheckStampFile)._M_string_length = 0;
  (this->CheckStampFile).field_2._M_local_buf[0] = '\0';
  (this->CheckStampList)._M_dataplus._M_p = (pointer)&(this->CheckStampList).field_2;
  (this->CheckStampList)._M_string_length = 0;
  (this->CheckStampList).field_2._M_local_buf[0] = '\0';
  (this->VSSolutionFile)._M_dataplus._M_p = (pointer)&(this->VSSolutionFile).field_2;
  (this->VSSolutionFile)._M_string_length = 0;
  (this->VSSolutionFile).field_2._M_local_buf[0] = '\0';
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFileExtensionsSet)._M_h._M_buckets =
       &(this->SourceFileExtensionsSet)._M_h._M_single_bucket;
  (this->SourceFileExtensionsSet)._M_h._M_bucket_count = 1;
  (this->SourceFileExtensionsSet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->SourceFileExtensionsSet)._M_h._M_element_count = 0;
  (this->SourceFileExtensionsSet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->SourceFileExtensionsSet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->SourceFileExtensionsSet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeaderFileExtensionsSet)._M_h._M_buckets =
       &(this->HeaderFileExtensionsSet)._M_h._M_single_bucket;
  (this->HeaderFileExtensionsSet)._M_h._M_bucket_count = 1;
  (this->HeaderFileExtensionsSet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->HeaderFileExtensionsSet)._M_h._M_element_count = 0;
  (this->HeaderFileExtensionsSet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->HeaderFileExtensionsSet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->HeaderFileExtensionsSet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GraphVizFile)._M_dataplus._M_p = (pointer)&(this->GraphVizFile).field_2;
  (this->GraphVizFile)._M_string_length = 0;
  (this->GraphVizFile).field_2._M_local_buf[0] = '\0';
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = (cmFileAPI *)0x0;
  this_00 = &this->SourceFileExtensions;
  this_01 = &this->HeaderFileExtensions;
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->ClearBuildSystem = false;
  this->DebugTryCompile = false;
  this_02 = (cmFileTimeCache *)operator_new(0x38);
  cmFileTimeCache::cmFileTimeCache(this_02);
  this->FileTimeCache = this_02;
  this_03 = (cmState *)operator_new(0x228);
  cmState::cmState(this_03);
  this->State = this_03;
  cmState::SetMode(this_03,mode);
  cmState::CreateBaseSnapshot(&local_48,this->State);
  (this->CurrentSnapshot).Position.Position = local_48.Position.Position;
  (this->CurrentSnapshot).State = local_48.State;
  (this->CurrentSnapshot).Position.Tree = local_48.Position.Tree;
  pcVar4 = (cmMessenger *)operator_new(4);
  pcVar4->SuppressDevWarnings = false;
  pcVar4->SuppressDeprecatedWarnings = false;
  pcVar4->DevWarningsAsErrors = false;
  pcVar4->DeprecatedWarningsAsErrors = false;
  this->Messenger = pcVar4;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  this->CurrentWorkingMode = NORMAL_MODE;
  this_04 = (cmVariableWatch *)operator_new(0x30);
  cmVariableWatch::cmVariableWatch(this_04);
  this->VariableWatch = this_04;
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if (role - RoleScript < 2) {
    GetScriptingCommands(this->State);
  }
  if (role == RoleProject) {
    GetProjectCommands(this->State);
  }
  cmSystemTools::EnableVSConsoleOutput();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x4d707f);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x483556);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])0x482dba);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])0x482dbf);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])0x4ddc10);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])0x49a165);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])0x482de7);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x482db1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x483365);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])0x482dc3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_R8;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string*,std::insert_iterator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (this->SourceFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->SourceFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->SourceFileExtensionsSet,
             (insert_iterator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(auVar2 << 0x40));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [2])0x47fb57);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [3])"hh");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [4])0x482dee);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [3])0x482df3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [4])0x482df7);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [4])0x482dfc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [3])0x4b15de);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [4])0x482e01);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R8;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string*,std::insert_iterator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             (this->HeaderFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->HeaderFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->HeaderFileExtensionsSet,
             (insert_iterator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(auVar3 << 0x40));
  return;
}

Assistant:

cmake::cmake(Role role, cmState::Mode mode)
{
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->DebugTryCompile = false;
  this->ClearBuildSystem = false;
  this->FileTimeCache = new cmFileTimeCache;

  this->State = new cmState;
  this->State->SetMode(mode);
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();
  this->Messenger = new cmMessenger;

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif

  this->GlobalGenerator = nullptr;
  this->CurrentWorkingMode = NORMAL_MODE;

#ifdef CMAKE_BUILD_WITH_CMAKE
  this->VariableWatch = new cmVariableWatch;
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions
  // these are used to find files when the extension
  // is not given
  // The "c" extension MUST precede the "C" extension.
  this->SourceFileExtensions.emplace_back("c");
  this->SourceFileExtensions.emplace_back("C");

  this->SourceFileExtensions.emplace_back("c++");
  this->SourceFileExtensions.emplace_back("cc");
  this->SourceFileExtensions.emplace_back("cpp");
  this->SourceFileExtensions.emplace_back("cxx");
  this->SourceFileExtensions.emplace_back("cu");
  this->SourceFileExtensions.emplace_back("m");
  this->SourceFileExtensions.emplace_back("M");
  this->SourceFileExtensions.emplace_back("mm");

  std::copy(this->SourceFileExtensions.begin(),
            this->SourceFileExtensions.end(),
            std::inserter(this->SourceFileExtensionsSet,
                          this->SourceFileExtensionsSet.end()));

  this->HeaderFileExtensions.emplace_back("h");
  this->HeaderFileExtensions.emplace_back("hh");
  this->HeaderFileExtensions.emplace_back("h++");
  this->HeaderFileExtensions.emplace_back("hm");
  this->HeaderFileExtensions.emplace_back("hpp");
  this->HeaderFileExtensions.emplace_back("hxx");
  this->HeaderFileExtensions.emplace_back("in");
  this->HeaderFileExtensions.emplace_back("txx");

  std::copy(this->HeaderFileExtensions.begin(),
            this->HeaderFileExtensions.end(),
            std::inserter(this->HeaderFileExtensionsSet,
                          this->HeaderFileExtensionsSet.end()));
}